

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int c1f5kb_(int *ido,int *l1,int *na,double *cc,int *in1,double *ch,int *in2,double *wa)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  uint uVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  double *pdVar27;
  ulong uVar28;
  long lVar29;
  double *pdVar30;
  double *pdVar31;
  ulong uVar32;
  double *pdVar33;
  uint uVar34;
  long lVar35;
  double *pdVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double *local_120;
  
  iVar2 = *ido;
  lVar26 = (long)iVar2;
  lVar13 = (long)*in1;
  uVar3 = *l1;
  lVar29 = (long)(int)uVar3;
  uVar34 = (iVar2 + 1) * uVar3;
  lVar22 = (long)*in2;
  iVar19 = iVar2 * 5 + 1;
  lVar5 = (long)(int)(~uVar34 * *in1 + -1);
  if ((lVar26 < 2) && (*na != 1)) {
    uVar28 = 0;
    if (0 < (int)uVar3) {
      uVar28 = (ulong)uVar3;
    }
    pdVar7 = cc + ((long)(int)((iVar2 * 2 + 1) * uVar3) + 1) * lVar13 + 1;
    pdVar10 = cc + ((long)(int)(iVar19 * uVar3) + 1) * lVar13 + 1;
    pdVar11 = cc + ((long)(int)((iVar2 * 3 + 1) * uVar3) + 1) * lVar13 + 1;
    pdVar20 = cc + ((long)(int)((iVar2 * 4 + 1) * uVar3) + 1) * lVar13 + 1;
    pdVar23 = cc + ((long)(int)uVar34 + 1) * lVar13 + 1;
    while (bVar37 = uVar28 != 0, uVar28 = uVar28 - 1, bVar37) {
      dVar41 = pdVar7[lVar5];
      dVar45 = (pdVar7 + lVar5)[1];
      dVar38 = pdVar10[lVar5];
      dVar39 = (pdVar10 + lVar5)[1];
      dVar48 = dVar41 - dVar38;
      dVar49 = dVar45 - dVar39;
      dVar40 = pdVar11[lVar5];
      dVar42 = (pdVar11 + lVar5)[1];
      dVar43 = pdVar20[lVar5];
      dVar44 = (pdVar20 + lVar5)[1];
      dVar46 = dVar40 - dVar43;
      dVar47 = dVar42 - dVar44;
      dVar41 = dVar41 + dVar38;
      dVar45 = dVar45 + dVar39;
      dVar40 = dVar40 + dVar43;
      dVar42 = dVar42 + dVar44;
      dVar38 = pdVar23[lVar5];
      dVar39 = (pdVar23 + lVar5)[1];
      dVar43 = dVar40 * -0.8090169943749475 + dVar41 * 0.3090169943749474 + dVar38;
      dVar50 = dVar42 * -0.8090169943749475 + dVar45 * 0.3090169943749474 + dVar39;
      pdVar23[lVar5] = dVar41 + dVar38 + dVar40;
      (pdVar23 + lVar5)[1] = dVar45 + dVar39 + dVar42;
      dVar51 = dVar48 * 0.9510565162951536 + dVar46 * 0.5877852522924731;
      dVar44 = dVar49 * 0.9510565162951536 + dVar47 * 0.5877852522924731;
      pdVar7[lVar5] = dVar43 - dVar44;
      pdVar10[lVar5] = dVar44 + dVar43;
      pdVar7[lVar5 + 1] = dVar51 + dVar50;
      dVar41 = dVar40 * 0.3090169943749474 + dVar41 * -0.8090169943749475 + dVar38;
      dVar38 = dVar48 * 0.5877852522924731 + dVar46 * -0.9510565162951536;
      dVar40 = dVar49 * 0.5877852522924731 + dVar47 * -0.9510565162951536;
      dVar45 = dVar42 * 0.3090169943749474 + dVar45 * -0.8090169943749475 + dVar39;
      pdVar11[lVar5] = dVar41 - dVar40;
      (pdVar11 + lVar5)[1] = dVar38 + dVar45;
      pdVar20[lVar5] = dVar41 + dVar40;
      (pdVar20 + lVar5)[1] = dVar45 - dVar38;
      pdVar10[lVar5 + 1] = dVar50 - dVar51;
      pdVar7 = pdVar7 + lVar13;
      pdVar10 = pdVar10 + lVar13;
      pdVar11 = pdVar11 + lVar13;
      pdVar20 = pdVar20 + lVar13;
      pdVar23 = pdVar23 + lVar13;
    }
  }
  else {
    uVar4 = iVar2 * 5;
    uVar9 = ~uVar4;
    lVar6 = (long)(int)(~(uVar3 * 6) * *in2 + -1);
    uVar28 = 0;
    if (0 < (int)uVar3) {
      uVar28 = (ulong)uVar3;
    }
    pdVar20 = cc + ((long)(int)((iVar2 * 2 + 1) * uVar3) + 1) * lVar13 + 2;
    pdVar23 = cc + ((long)(int)(iVar19 * uVar3) + 1) * lVar13 + 2;
    pdVar30 = cc + ((long)(int)((iVar2 * 3 + 1) * uVar3) + 1) * lVar13 + 2;
    pdVar21 = cc + ((long)(int)((iVar2 * 4 + 1) * uVar3) + 1) * lVar13 + 2;
    pdVar24 = cc + ((long)(int)uVar34 + 1) * lVar13 + 2;
    pdVar11 = ch + ((long)(int)(uVar3 * 6) + 1) * lVar22 + 2;
    pdVar7 = ch + ((long)(int)(uVar3 * 7) + 1) * lVar22 + 2;
    pdVar10 = ch + ((long)(int)(uVar3 * 10) + 1) * lVar22 + 2;
    pdVar14 = ch + ((long)(int)(uVar3 * 8) + 1) * lVar22 + 1;
    pdVar16 = ch + ((long)(int)(uVar3 * 9) + 1) * lVar22 + 1;
    uVar32 = uVar28;
    while (bVar37 = uVar32 != 0, uVar32 = uVar32 - 1, bVar37) {
      dVar44 = pdVar20[lVar5] - pdVar23[lVar5];
      dVar38 = pdVar20[lVar5] + pdVar23[lVar5];
      dVar43 = pdVar30[lVar5] - pdVar21[lVar5];
      dVar49 = pdVar30[lVar5] + pdVar21[lVar5];
      dVar47 = pdVar20[lVar5 + -1] - pdVar23[lVar5 + -1];
      dVar42 = pdVar20[lVar5 + -1] + pdVar23[lVar5 + -1];
      dVar46 = pdVar30[lVar5 + -1] - pdVar21[lVar5 + -1];
      dVar40 = pdVar30[lVar5 + -1] + pdVar21[lVar5 + -1];
      pdVar11[lVar6 + -1] = pdVar24[lVar5 + -1] + dVar42 + dVar40;
      pdVar11[lVar6] = pdVar24[lVar5] + dVar38 + dVar49;
      dVar41 = pdVar24[lVar5 + -1];
      dVar45 = pdVar24[lVar5];
      dVar51 = dVar40 * -0.8090169943749475 + dVar42 * 0.3090169943749474 + dVar41;
      dVar50 = dVar49 * -0.8090169943749475 + dVar38 * 0.3090169943749474 + dVar45;
      dVar48 = dVar47 * 0.9510565162951536 + dVar46 * 0.5877852522924731;
      dVar39 = dVar44 * 0.9510565162951536 + dVar43 * 0.5877852522924731;
      pdVar7[lVar6 + -1] = dVar51 - dVar39;
      pdVar10[lVar6 + -1] = dVar39 + dVar51;
      pdVar7[lVar6] = dVar48 + dVar50;
      dVar41 = dVar40 * 0.3090169943749474 + dVar42 * -0.8090169943749475 + dVar41;
      dVar39 = dVar47 * 0.5877852522924731 + dVar46 * -0.9510565162951536;
      dVar40 = dVar44 * 0.5877852522924731 + dVar43 * -0.9510565162951536;
      dVar45 = dVar49 * 0.3090169943749474 + dVar38 * -0.8090169943749475 + dVar45;
      pdVar14[lVar6] = dVar41 - dVar40;
      (pdVar14 + lVar6)[1] = dVar39 + dVar45;
      pdVar16[lVar6] = dVar41 + dVar40;
      (pdVar16 + lVar6)[1] = dVar45 - dVar39;
      pdVar10[lVar6] = dVar50 - dVar48;
      pdVar20 = pdVar20 + lVar13;
      pdVar23 = pdVar23 + lVar13;
      pdVar30 = pdVar30 + lVar13;
      pdVar21 = pdVar21 + lVar13;
      pdVar24 = pdVar24 + lVar13;
      pdVar11 = pdVar11 + lVar22;
      pdVar7 = pdVar7 + lVar22;
      pdVar10 = pdVar10 + lVar22;
      pdVar14 = pdVar14 + lVar22;
      pdVar16 = pdVar16 + lVar22;
    }
    if (iVar2 != 1) {
      pdVar16 = cc + (((long)(iVar2 * 2) + 2) * lVar29 + 1) * lVar13 + 2;
      lVar35 = lVar29 * lVar13;
      pdVar30 = cc + (((long)(int)uVar4 + 2) * lVar29 + 1) * lVar13 + 2;
      pdVar24 = cc + (((long)(iVar2 * 3) + 2) * lVar29 + 1) * lVar13 + 2;
      pdVar14 = cc + (((long)(iVar2 * 4) + 2) * lVar29 + 1) * lVar13 + 2;
      pdVar20 = cc + ((lVar26 + 2) * lVar29 + 1) * lVar13 + 2;
      lVar8 = lVar29 * lVar22;
      pdVar23 = ch + (lVar29 * 0xb + 1) * lVar22 + 2;
      pdVar7 = ch + (lVar29 * 0xc + 1) * lVar22 + 2;
      pdVar10 = ch + (lVar29 * 0xd + 1) * lVar22 + 2;
      pdVar11 = ch + (lVar29 * 0xe + 1) * lVar22 + 2;
      pdVar21 = ch + (lVar29 * 0xf + 1) * lVar22 + 2;
      for (lVar29 = 2; lVar29 <= lVar26; lVar29 = lVar29 + 1) {
        lVar1 = (int)uVar4 + lVar29;
        pdVar12 = pdVar11;
        pdVar15 = pdVar14;
        pdVar17 = pdVar16;
        pdVar18 = pdVar21;
        pdVar25 = pdVar24;
        pdVar27 = pdVar23;
        uVar32 = uVar28;
        pdVar31 = pdVar30;
        pdVar33 = pdVar20;
        pdVar36 = pdVar10;
        local_120 = pdVar7;
        while (bVar37 = uVar32 != 0, uVar32 = uVar32 - 1, bVar37) {
          dVar45 = pdVar17[lVar5] - pdVar31[lVar5];
          dVar39 = pdVar17[lVar5] + pdVar31[lVar5];
          dVar44 = pdVar25[lVar5] - pdVar15[lVar5];
          dVar41 = pdVar25[lVar5] + pdVar15[lVar5];
          dVar42 = pdVar17[lVar5 + -1] - pdVar31[lVar5 + -1];
          dVar40 = pdVar17[lVar5 + -1] + pdVar31[lVar5 + -1];
          dVar47 = pdVar25[lVar5 + -1] - pdVar15[lVar5 + -1];
          dVar38 = pdVar25[lVar5 + -1] + pdVar15[lVar5 + -1];
          pdVar27[lVar6 + -1] = pdVar33[lVar5 + -1] + dVar40 + dVar38;
          pdVar27[lVar6] = pdVar33[lVar5] + dVar39 + dVar41;
          dVar43 = dVar38 * -0.8090169943749475 + dVar40 * 0.3090169943749474 + pdVar33[lVar5 + -1];
          dVar48 = dVar41 * -0.8090169943749475 + dVar39 * 0.3090169943749474 + pdVar33[lVar5];
          dVar40 = dVar38 * 0.3090169943749474 + dVar40 * -0.8090169943749475 + pdVar33[lVar5 + -1];
          dVar39 = dVar41 * 0.3090169943749474 + dVar39 * -0.8090169943749475 + pdVar33[lVar5];
          dVar41 = dVar42 * 0.9510565162951536 + dVar47 * 0.5877852522924731;
          dVar46 = dVar45 * 0.9510565162951536 + dVar44 * 0.5877852522924731;
          dVar42 = dVar42 * 0.5877852522924731 + dVar47 * -0.9510565162951536;
          dVar38 = dVar45 * 0.5877852522924731 + dVar44 * -0.9510565162951536;
          dVar45 = dVar40 - dVar38;
          dVar38 = dVar38 + dVar40;
          dVar44 = dVar42 + dVar39;
          dVar39 = dVar39 - dVar42;
          dVar40 = dVar46 + dVar43;
          dVar43 = dVar43 - dVar46;
          dVar42 = dVar48 - dVar41;
          dVar41 = dVar41 + dVar48;
          local_120[lVar6 + -1] =
               wa[(int)uVar9 + lVar1] * dVar43 - wa[(long)(int)uVar9 + lVar26 * 9 + lVar29] * dVar41
          ;
          local_120[lVar6] =
               dVar41 * wa[(int)uVar9 + lVar1] + dVar43 * wa[(long)(int)uVar9 + lVar26 * 9 + lVar29]
          ;
          pdVar36[lVar6 + -1] =
               wa[(long)(int)uVar9 + lVar26 * 6 + lVar29] * dVar45 -
               wa[(long)(int)uVar9 + lVar26 * 10 + lVar29] * dVar44;
          pdVar36[lVar6] =
               dVar44 * wa[(long)(int)uVar9 + lVar26 * 6 + lVar29] +
               dVar45 * wa[(long)(int)uVar9 + lVar26 * 10 + lVar29];
          pdVar12[lVar6 + -1] =
               wa[(long)(int)uVar9 + lVar26 * 7 + lVar29] * dVar38 -
               wa[(long)(int)uVar9 + lVar26 * 0xb + lVar29] * dVar39;
          pdVar12[lVar6] =
               dVar39 * wa[(long)(int)uVar9 + lVar26 * 7 + lVar29] +
               dVar38 * wa[(long)(int)uVar9 + lVar26 * 0xb + lVar29];
          pdVar18[lVar6 + -1] =
               wa[(long)(int)uVar9 + iVar2 * 8 + lVar29] * dVar40 -
               wa[(long)(int)uVar9 + lVar26 * 0xc + lVar29] * dVar42;
          pdVar18[lVar6] =
               dVar42 * wa[(long)(int)uVar9 + iVar2 * 8 + lVar29] +
               dVar40 * wa[(long)(int)uVar9 + lVar26 * 0xc + lVar29];
          pdVar17 = pdVar17 + lVar13;
          pdVar31 = pdVar31 + lVar13;
          pdVar25 = pdVar25 + lVar13;
          pdVar15 = pdVar15 + lVar13;
          pdVar33 = pdVar33 + lVar13;
          pdVar27 = pdVar27 + lVar22;
          local_120 = local_120 + lVar22;
          pdVar36 = pdVar36 + lVar22;
          pdVar12 = pdVar12 + lVar22;
          pdVar18 = pdVar18 + lVar22;
        }
        pdVar16 = pdVar16 + lVar35;
        pdVar30 = pdVar30 + lVar35;
        pdVar24 = pdVar24 + lVar35;
        pdVar14 = pdVar14 + lVar35;
        pdVar20 = pdVar20 + lVar35;
        pdVar23 = pdVar23 + lVar8 * 5;
        pdVar7 = pdVar7 + lVar8 * 5;
        pdVar10 = pdVar10 + lVar8 * 5;
        pdVar11 = pdVar11 + lVar8 * 5;
        pdVar21 = pdVar21 + lVar8 * 5;
      }
    }
  }
  return 0;
}

Assistant:

int c1f5kb_(int *ido, int *l1, int *na, fft_real_t *cc,
	 int *in1, fft_real_t *ch, int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = .9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = .5877852522924731;

    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2;

    /* Local variables */
     int i__, k;
     fft_real_t ci2, ci3, ci4, ci5, di3, di4, di5, di2, cr2, cr3, cr5, cr4,
	    dr3, dr4, ti2, ti3, ti4, ti5, dr5, dr2, tr2, tr3, tr4, tr5,
	    chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.1 auxiliary routine */

    if (*ido > 1 || *na == 1) {
	goto L102;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	chold1 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	chold2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = chold1;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = chold2;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] = cr2 - ci5;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1] = cr2 + ci5;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] = ci2 + cr5;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] = ci3 + cr4;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] = cr3 - ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1] = cr3 + ci4;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2] = ci3 - cr4;
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2] = ci2 - cr5;
/* L101: */
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 1] + tr2 + tr3;
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = cr2 - ci5;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = cr2 + ci5;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = ci2 + cr5;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = ci3 + cr4;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = cr3 - ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = cr3 + ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = ci3 - cr4;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = ci2 - cr5;
/* L103: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ti5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    ti3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    tr5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    tr3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 2] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	    cr2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 *
		    tr2 + tr12 * tr3;
	    ci2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr11 *
		    ti2 + tr12 * ti3;
	    cr3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 *
		    tr2 + tr11 * tr3;
	    ci3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr12 *
		    ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    dr3 = cr3 - ci4;
	    dr4 = cr3 + ci4;
	    di3 = ci3 + cr4;
	    di4 = ci3 - cr4;
	    dr5 = cr2 + ci5;
	    dr2 = cr2 - ci5;
	    di5 = ci2 - cr5;
	    di2 = ci2 + cr5;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 5] * dr2 - wa[i__ + wa_dim1 * 9] * di2;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 5] * di2 + wa[i__ + wa_dim1 * 9] * dr2;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 6] * dr3 - wa[i__ + wa_dim1 * 10] * di3;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 6] * di3 + wa[i__ + wa_dim1 * 10] * dr3;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 7] * dr4 - wa[i__ + wa_dim1 * 11] * di4;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 7] * di4 + wa[i__ + wa_dim1 * 11] * dr4;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 1] = wa[i__ + (
		    wa_dim1 << 3)] * dr5 - wa[i__ + wa_dim1 * 12] * di5;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 2] = wa[i__ + (
		    wa_dim1 << 3)] * di5 + wa[i__ + wa_dim1 * 12] * dr5;
/* L104: */
	}
/* L105: */
    }
    return 0;
}